

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

SwitchStatement * __thiscall SQASTReader::readSwitchStatement(SQASTReader *this)

{
  Arena *this_00;
  SwitchStatement *this_01;
  InputStream *pIVar1;
  int iVar2;
  Expr *pEVar3;
  Chunk *pCVar4;
  Statement *pSVar5;
  byte bVar6;
  uint64_t v;
  ulong uVar7;
  
  pEVar3 = readExpression(this);
  this_00 = this->astArena;
  pCVar4 = Arena::findChunk(this_00,0x50);
  this_01 = (SwitchStatement *)pCVar4->_ptr;
  pCVar4->_ptr = (uint8_t *)(this_01 + 1);
  (this_01->super_Statement).super_Node._op = TO_SWITCH;
  (this_01->super_Statement).super_Node._coordinates.lineStart = -1;
  (this_01->super_Statement).super_Node._coordinates.columnStart = -1;
  (this_01->super_Statement).super_Node._coordinates.lineEnd = -1;
  (this_01->super_Statement).super_Node._coordinates.columnEnd = -1;
  (this_01->super_Statement).super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a46b8;
  this_01->_expr = pEVar3;
  (this_01->_cases)._arena = this_00;
  (this_01->_cases)._vals = (SwitchCase *)0x0;
  (this_01->_cases)._size = 0;
  (this_01->_cases)._allocated = 0;
  (this_01->_defaultCase).val = (Expr *)0x0;
  (this_01->_defaultCase).stmt = (Statement *)0x0;
  pIVar1 = this->stream;
  uVar7 = 0;
  bVar6 = 0;
  do {
    iVar2 = (**pIVar1->_vptr_InputStream)(pIVar1);
    uVar7 = uVar7 | (ulong)((byte)iVar2 & 0x7f) << (bVar6 & 0x3f);
    bVar6 = bVar6 + 7;
  } while ((char)(byte)iVar2 < '\0');
  ArenaVector<SQCompilation::SwitchCase>::resize(&this_01->_cases,(size_type_conflict)uVar7);
  for (; uVar7 != 0; uVar7 = uVar7 - 1) {
    pEVar3 = readExpression(this);
    pSVar5 = readStatement(this);
    SQCompilation::SwitchStatement::addCases(this_01,pEVar3,pSVar5);
  }
  pSVar5 = readNullableStatement(this);
  (this_01->_defaultCase).stmt = pSVar5;
  return this_01;
}

Assistant:

SwitchStatement *SQASTReader::readSwitchStatement() {
  Expr *expr = readExpression();

  SwitchStatement *swtch = newNode<SwitchStatement>(astArena, (Expr *)expr);

  size_t size = stream->readUInt64();

  swtch->cases().resize(size);

  for (size_t i = 0; i < size; ++i) {
    Expr *v = readExpression();
    Statement *s = readStatement();

    swtch->addCases(v, s);
  }

  swtch->addDefault(readNullableStatement());

  return swtch;
}